

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointAction::~IfcStructuralPointAction
          (IfcStructuralPointAction *this)

{
  undefined1 *puVar1;
  undefined1 *puVar2;
  
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       0x8edb10;
  *(undefined8 *)&(this->super_IfcStructuralAction).field_0x188 = 0x8edc00;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x88 = 0x8edb38;
  (this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8edb60;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x8edb88;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.field_0x100 =
       0x8edbb0;
  *(undefined8 *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.field_0x138 =
       0x8edbd8;
  puVar2 = *(undefined1 **)
            &(this->super_IfcStructuralAction).super_IfcStructuralActivity.field_0x148;
  puVar1 = &(this->super_IfcStructuralAction).field_0x158;
  if (puVar2 != puVar1) {
    operator_delete(puVar2,*(long *)puVar1 + 1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)this,&PTR_construction_vtable_24__008ed980);
  operator_delete(this,0x1a0);
  return;
}

Assistant:

IfcStructuralPointAction() : Object("IfcStructuralPointAction") {}